

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEditBox.cpp
# Opt level: O2

bool __thiscall irr::gui::CGUIEditBox::OnEvent(CGUIEditBox *this,SEvent *event)

{
  long *plVar1;
  char cVar2;
  bool bVar3;
  undefined1 uVar4;
  
  cVar2 = (**(code **)(*(long *)this + 0x90))();
  if (cVar2 == '\0') goto switchD_00228cf9_default;
  switch(event->EventType) {
  case EET_GUI_EVENT:
    if (((event->field_1).GUIEvent.EventType == EGET_ELEMENT_FOCUS_LOST) &&
       ((CGUIEditBox *)(event->field_1).GUIEvent.Caller == this)) {
      this->MouseMarking = false;
      setTextMarkers(this,0,0);
    }
    goto switchD_00228cf9_default;
  case EET_MOUSE_INPUT_EVENT:
    bVar3 = processMouse(this,event);
    break;
  case EET_KEY_INPUT_EVENT:
    bVar3 = processKey(this,event);
    break;
  case EET_STRING_INPUT_EVENT:
    inputString(this,(stringw *)(event->field_1).GUIEvent.Caller);
    return true;
  default:
    goto switchD_00228cf9_default;
  }
  if (bVar3 != false) {
    return true;
  }
switchD_00228cf9_default:
  plVar1 = *(long **)&this->field_0x20;
  if (plVar1 == (long *)0x0) {
    return false;
  }
  uVar4 = (**(code **)(*plVar1 + 0x10))(plVar1,event);
  return (bool)uVar4;
}

Assistant:

bool CGUIEditBox::OnEvent(const SEvent &event)
{
	if (isEnabled()) {

		switch (event.EventType) {
		case EET_GUI_EVENT:
			if (event.GUIEvent.EventType == EGET_ELEMENT_FOCUS_LOST) {
				if (event.GUIEvent.Caller == this) {
					MouseMarking = false;
					setTextMarkers(0, 0);
				}
			}
			break;
		case EET_KEY_INPUT_EVENT:
			if (processKey(event))
				return true;
			break;
		case EET_MOUSE_INPUT_EVENT:
			if (processMouse(event))
				return true;
			break;
		case EET_STRING_INPUT_EVENT:
			inputString(*event.StringInput.Str);
			return true;
			break;
		default:
			break;
		}
	}

	return IGUIElement::OnEvent(event);
}